

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.hpp
# Opt level: O3

void __thiscall duckdb::ArrowArrayScanState::Reset(ArrowArrayScanState *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer this_01;
  _Hash_node_base *p_Var1;
  
  ArrowRunEndEncodingState::Reset(&this->run_end_encoding);
  for (p_Var1 = (this->children)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    this_01 = unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
              ::operator->((unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
                            *)(p_Var1 + 2));
    Reset(this_01);
  }
  this_00 = (this->owned_data).internal.
            super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->owned_data).internal.
  super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->owned_data).internal.
  super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void Reset() {
		// Note: dictionary is not reset
		// the dictionary should be the same for every array scanned of this column
		run_end_encoding.Reset();
		for (auto &child : children) {
			child.second->Reset();
		}
		owned_data.reset();
	}